

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

char * escape_string(char *src)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 1;
  lVar3 = 0;
  do {
    cVar1 = src[lVar4 + -1];
    if ((cVar1 == '\"') || (cVar1 == '\\')) {
      lVar3 = lVar3 + 1;
    }
    else if (cVar1 == '\0') {
      pcVar2 = (char *)(*Curl_cmalloc)(lVar4 + lVar3);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      lVar3 = 0;
      do {
        cVar1 = *src;
        if ((cVar1 == '\"') || (cVar1 == '\\')) {
          pcVar2[lVar3] = '\\';
          lVar3 = lVar3 + 1;
        }
        else if (cVar1 == '\0') {
          pcVar2[lVar3] = '\0';
          return pcVar2;
        }
        pcVar2[lVar3] = *src;
        lVar3 = lVar3 + 1;
        src = src + 1;
      } while( true );
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static char *escape_string(const char *src)
{
  size_t bytecount = 0;
  size_t i;
  char *dst;

  for(i = 0; src[i]; i++)
    if(src[i] == '"' || src[i] == '\\')
      bytecount++;

  bytecount += i;
  dst = malloc(bytecount + 1);
  if(!dst)
    return NULL;

  for(i = 0; *src; src++) {
    if(*src == '"' || *src == '\\')
      dst[i++] = '\\';
    dst[i++] = *src;
  }

  dst[i] = '\0';
  return dst;
}